

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idasRoberts_ASAi_dns.c
# Opt level: O3

void PrintOutput(sunrealtype tfinal,N_Vector yB,N_Vector ypB,N_Vector qB)

{
  ulong *puVar1;
  undefined8 *puVar2;
  
  puts("--------------------------------------------------------");
  printf("tB0:        %12.4e\n",tfinal);
  puVar1 = *(ulong **)((long)ypB->content + 0x10);
  printf("dG/dp:      %12.4e %12.4e %12.4e\n",*puVar1 ^ 0x8000000000000000,
         puVar1[1] ^ 0x8000000000000000,puVar1[2] ^ 0x8000000000000000);
  puVar2 = *(undefined8 **)((long)yB->content + 0x10);
  printf("lambda(t0): %12.4e %12.4e %12.4e\n",*puVar2,puVar2[1],puVar2[2]);
  puts("--------------------------------------------------------");
  return;
}

Assistant:

static void PrintOutput(sunrealtype tfinal, N_Vector yB, N_Vector ypB, N_Vector qB)
{
  printf("--------------------------------------------------------\n");
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("tB0:        %12.4Le\n", tfinal);
  printf("dG/dp:      %12.4Le %12.4Le %12.4Le\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
  printf("lambda(t0): %12.4Le %12.4Le %12.4Le\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("tB0:        %12.4e\n", tfinal);
  printf("dG/dp:      %12.4e %12.4e %12.4e\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
  printf("lambda(t0): %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
#else
  printf("tB0:        %12.4e\n", tfinal);
  printf("dG/dp:      %12.4e %12.4e %12.4e\n", -Ith(qB, 1), -Ith(qB, 2),
         -Ith(qB, 3));
  printf("lambda(t0): %12.4e %12.4e %12.4e\n", Ith(yB, 1), Ith(yB, 2),
         Ith(yB, 3));
#endif
  printf("--------------------------------------------------------\n");
}